

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec_tracker.cpp
# Opt level: O3

void __thiscall despot::ExecTracker::Print(ExecTracker *this,ostream *out)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  _Self __tmp;
  
  for (p_Var2 = (this->creation_loc_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->creation_loc_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"(",1);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,*(char **)(p_Var2 + 2),(long)p_Var2[2]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  return;
}

Assistant:

void ExecTracker::Print(ostream& out) const {
	for (map<string, string>::const_iterator it = creation_loc_.begin();
		it != creation_loc_.end(); it++) {
		out << "(" << it->first << ", " << it->second << ")" << endl;
	}
}